

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packets.c
# Opt level: O1

int rtr_sync_receive_and_store_pdus(rtr_socket *rtr_socket)

{
  size_t size;
  long lVar1;
  bool bVar2;
  pdu_aspa **pppVar3;
  int iVar4;
  uint uVar5;
  pdu_aspa **pppVar6;
  size_t sVar7;
  pfx_table *pfx_table;
  pdu_router_key *ppVar8;
  pdu_aspa *__dest;
  aspa_table *aspa_table;
  pdu_router_key **timeout;
  pdu_ipv6 **ary;
  undefined8 uVar9;
  undefined8 uVar10;
  spki_table *unaff_RBP;
  uint *ind;
  uint *size_00;
  uint uVar11;
  uint uVar12;
  uint router_key_pdu_count;
  ulong uVar13;
  long in_FS_OFFSET;
  recv_loop_cleanup_args cleanup_args;
  int oldcancelstate;
  size_t aspa_pdus_count;
  pdu_aspa **aspa_pdus;
  pdu_router_key *router_key_pdus;
  uint ipv4_pdus_nindex;
  uint ipv4_pdus_size;
  pdu_ipv4 *ipv4_pdus;
  uint ipv6_pdus_size;
  uint ipv6_pdus_nindex;
  pdu_ipv6 *ipv6_pdus;
  pdu_end_of_data_v0 apStack_100a8 [5461];
  char txt [15];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar13 = 0;
  cleanup_args.ipv6_pdus = &ipv6_pdus;
  ipv6_pdus = (pdu_ipv6 *)0x0;
  ipv6_pdus_nindex = 0;
  ipv6_pdus_size = 0;
  cleanup_args.ipv4_pdus = &ipv4_pdus;
  ipv4_pdus = (pdu_ipv4 *)0x0;
  ipv4_pdus_size = 0;
  ipv4_pdus_nindex = 0;
  timeout = &router_key_pdus;
  router_key_pdus = (pdu_router_key *)0x0;
  aspa_table = (aspa_table *)&aspa_pdus;
  aspa_pdus = (pdu_aspa **)0x0;
  cleanup_args.aspa_pdu_count = &aspa_pdus_count;
  aspa_pdus_count = 0;
  uVar12 = 0;
  router_key_pdu_count = 0;
  cleanup_args.router_key_pdus = timeout;
  cleanup_args.aspa_pdus = (pdu_aspa ***)aspa_table;
  while( true ) {
    iVar4 = __sigsetjmp((__pthread_unwind_buf_t *)txt,0);
    if (iVar4 != 0) {
      recv_loop_cleanup(&cleanup_args);
      __pthread_unwind_next((__pthread_unwind_buf_t *)txt);
      goto LAB_0010a760;
    }
    __pthread_register_cancel((__pthread_unwind_buf_t *)txt);
    pthread_setcancelstate(0,&oldcancelstate);
    iVar4 = rtr_receive_pdu(rtr_socket,apStack_100a8,0x3c,(time_t)timeout);
    pthread_setcancelstate(1,&oldcancelstate);
    __pthread_unregister_cancel((__pthread_unwind_buf_t *)txt);
    if (iVar4 == -2) break;
    if (iVar4 < 0) goto LAB_0010a70f;
    uVar5 = (uint)apStack_100a8[0].type;
    switch(apStack_100a8[0].type) {
    case '\0':
      timeout = (pdu_router_key **)0x0;
      lrtr_dbg("RTR Socket: Ignoring Serial Notify");
      break;
    default:
      lrtr_dbg("RTR Socket: Received unexpected PDU (Type: %u)",(ulong)uVar5);
      txt._0_6_ = (undefined6)
                  CONCAT44(apStack_100a8[0].len,
                           CONCAT22(apStack_100a8[0].session_id,
                                    CONCAT11(apStack_100a8[0].type,apStack_100a8[0].ver)));
      txt[6] = (char)(apStack_100a8[0].len >> 0x10);
      txt[7] = (char)(apStack_100a8[0].len >> 0x18);
      rtr_pdu_convert_header_byte_order(txt,TO_NETWORK_BYTE_ORDER);
      rtr_send_error_pdu(rtr_socket,txt,8,CORRUPT_DATA,
                         "Unexpected PDU received during data synchronisation",0x34);
      timeout = (pdu_router_key **)0xffffffff;
      break;
    case '\x04':
      uVar11 = 0x14;
      ary = (pdu_ipv6 **)&ipv4_pdus;
      ind = &ipv4_pdus_nindex;
      size_00 = &ipv4_pdus_size;
      goto LAB_00109e9b;
    case '\x06':
      uVar11 = 0x20;
      ary = &ipv6_pdus;
      ind = &ipv6_pdus_nindex;
      size_00 = &ipv6_pdus_size;
LAB_00109e9b:
      iVar4 = rtr_store_prefix_pdu(rtr_socket,apStack_100a8,uVar11,ary,ind,size_00);
      if (iVar4 == -1) {
LAB_0010a25d:
        rtr_change_socket_state(rtr_socket,RTR_ERROR_FATAL);
LAB_0010a26a:
        timeout = (pdu_router_key **)0xffffffff;
      }
      else {
LAB_00109ea9:
        timeout = (pdu_router_key **)0x0;
      }
      break;
    case '\a':
      lrtr_dbg("RTR Socket: EOD PDU received.");
      if (rtr_socket->session_id == (uint)apStack_100a8[0].session_id) {
        bVar2 = true;
        uVar11 = 0;
        if (((byte)(apStack_100a8[0].ver - 1) < 2) &&
           (uVar11 = 0, rtr_socket->iv_mode != RTR_INTERVAL_MODE_IGNORE_ANY)) {
          iVar4 = rtr_check_interval_option
                            (rtr_socket,rtr_socket->iv_mode,apStack_100a8[1].sn,
                             RTR_INTERVAL_TYPE_EXPIRATION);
          if (iVar4 == -1) {
            uVar10 = 600;
            uVar9 = 0x2a300;
            uVar11 = apStack_100a8[1].sn;
          }
          else {
            iVar4 = rtr_check_interval_option
                              (rtr_socket,rtr_socket->iv_mode,apStack_100a8[1]._0_4_,
                               RTR_INTERVAL_TYPE_REFRESH);
            if (iVar4 != -1) {
              iVar4 = rtr_check_interval_option
                                (rtr_socket,rtr_socket->iv_mode,apStack_100a8[1].len,
                                 RTR_INTERVAL_TYPE_RETRY);
              if (iVar4 == -1) {
                lrtr_dbg("RTR Socket: Received expiration value out of range. Was %u, must be between %u and %u."
                         ,(ulong)apStack_100a8[1].len,1,0x1c20);
                rtr_send_error_pdu(rtr_socket,apStack_100a8,0xffff,CORRUPT_DATA,
                                   "Interval value out of range",0x1c);
                uVar11 = 0xffffffff;
              }
              else {
                uVar11 = 0;
                lrtr_dbg("RTR Socket: New interval values: expire_interval:%u, refresh_interval:%u, retry_interval:%u"
                         ,(ulong)rtr_socket->expire_interval,(ulong)rtr_socket->refresh_interval);
              }
              bVar2 = iVar4 != -1;
              goto LAB_0010a031;
            }
            uVar10 = 1;
            uVar9 = 0x15180;
            uVar11 = apStack_100a8[1]._0_4_;
          }
          lrtr_dbg("RTR Socket: Received expiration value out of range. Was %u, must be between %u and %u."
                   ,(ulong)uVar11,uVar10,uVar9);
          bVar2 = false;
          rtr_send_error_pdu(rtr_socket,apStack_100a8,0xffff,CORRUPT_DATA,
                             "Interval value out of range",0x1c);
          uVar11 = 0xffffffff;
        }
      }
      else {
        bVar2 = false;
        snprintf(txt,0x43,"Expected session_id: %u, received session_id. %u in EOD PDU");
        sVar7 = strlen(txt);
        rtr_send_error_pdu_from_host
                  (rtr_socket,apStack_100a8,0xffff,CORRUPT_DATA,txt,(int)sVar7 + 1);
        rtr_change_socket_state(rtr_socket,RTR_ERROR_FATAL);
        uVar11 = 0xffffffff;
      }
LAB_0010a031:
      if (bVar2) {
        if (rtr_socket->is_resetting == true) {
          lrtr_dbg("RTR Socket: Reset in progress creating shadow table for atomic reset");
          pfx_table = (pfx_table *)lrtr_malloc(0x50);
          if (pfx_table == (pfx_table *)0x0) {
            lrtr_dbg("RTR Socket: Memory allocation for pfx shadow table failed");
LAB_0010a368:
            uVar11 = 0xffffffff;
          }
          else {
            pfx_table_init(pfx_table,(pfx_update_fp)0x0);
            iVar4 = pfx_table_copy_except_socket(rtr_socket->pfx_table,pfx_table,rtr_socket);
            if (iVar4 != 0) {
              lrtr_dbg("RTR Socket: Creation of pfx shadow table failed");
              rtr_change_socket_state(rtr_socket,RTR_ERROR_FATAL);
              goto LAB_0010a368;
            }
            unaff_RBP = (spki_table *)lrtr_malloc(0x170);
            if (unaff_RBP == (spki_table *)0x0) {
              lrtr_dbg("RTR Socket: Memory allocation for spki shadow table failed");
              unaff_RBP = (spki_table *)0x0;
              goto LAB_0010a368;
            }
            spki_table_init(unaff_RBP,(spki_update_fp)0x0);
            iVar4 = spki_table_copy_except_socket(rtr_socket->spki_table,unaff_RBP,rtr_socket);
            if (iVar4 != 0) {
              lrtr_dbg("RTR Socket: Creation of spki shadow table failed");
              rtr_change_socket_state(rtr_socket,RTR_ERROR_FATAL);
              goto LAB_0010a368;
            }
            aspa_table = (aspa_table *)lrtr_malloc(0x80);
            if (aspa_table == (aspa_table *)0x0) {
              lrtr_dbg("RTR Socket: Memory allocation for aspa shadow table failed");
              uVar11 = 0xffffffff;
              aspa_table = (aspa_table *)0x0;
            }
            else {
              aspa_table_init(aspa_table,(aspa_update_fp)0x0);
              lrtr_dbg("RTR Socket: Shadow tables created");
              uVar11 = rtr_sync_update_tables
                                 (rtr_socket,pfx_table,unaff_RBP,aspa_table,ipv4_pdus,
                                  ipv4_pdus_nindex,ipv6_pdus,ipv6_pdus_nindex,router_key_pdus,
                                  router_key_pdu_count,aspa_pdus,aspa_pdus_count,apStack_100a8);
              if (uVar11 == 0) {
                lrtr_dbg("RTR Socket: Reset finished. Swapping new table in.");
                pfx_table_swap(rtr_socket->pfx_table,pfx_table);
                spki_table_swap(rtr_socket->spki_table,unaff_RBP);
                lrtr_dbg("RTR Socket: Replacing ASPA records");
                aspa_table_src_replace
                          (rtr_socket->aspa_table,aspa_table,rtr_socket,
                           rtr_socket->aspa_table->update_fp != (aspa_update_fp)0x0,false);
                if (rtr_socket->pfx_table->update_fp == (pfx_update_fp)0x0) {
                  lrtr_dbg("RTR Socket: No pfx update callback. Skipping diff");
                }
                else {
                  lrtr_dbg("RTR Socket: Calculating and notifying pfx diff");
                  pfx_table_notify_diff(rtr_socket->pfx_table,pfx_table,rtr_socket);
                }
                if (rtr_socket->spki_table->update_fp == (spki_update_fp)0x0) {
                  lrtr_dbg("RTR Socket: No spki update callback. Skipping diff");
                }
                else {
                  lrtr_dbg("RTR Socket: Calculating and notifying spki diff");
                  spki_table_notify_diff(rtr_socket->spki_table,unaff_RBP,rtr_socket);
                }
                uVar11 = 0;
              }
            }
          }
          timeout = (pdu_router_key **)(ulong)uVar11;
          lrtr_dbg("RTR Socket: Freeing shadow tables.");
          if (pfx_table != (pfx_table *)0x0) {
            pfx_table_free_without_notify(pfx_table);
            lrtr_free(pfx_table);
          }
          if (unaff_RBP != (spki_table *)0x0) {
            spki_table_free_without_notify(unaff_RBP);
            lrtr_free(unaff_RBP);
          }
          if (aspa_table != (aspa_table *)0x0) {
            aspa_table_free(aspa_table,false);
            lrtr_free(aspa_table);
          }
          rtr_socket->is_resetting = false;
        }
        else {
          uVar11 = rtr_sync_update_tables
                             (rtr_socket,rtr_socket->pfx_table,rtr_socket->spki_table,
                              rtr_socket->aspa_table,ipv4_pdus,ipv4_pdus_nindex,ipv6_pdus,
                              ipv6_pdus_nindex,router_key_pdus,router_key_pdu_count,aspa_pdus,
                              aspa_pdus_count,apStack_100a8);
          timeout = (pdu_router_key **)(ulong)uVar11;
        }
      }
      else {
        timeout = (pdu_router_key **)(ulong)uVar11;
      }
      break;
    case '\t':
      ppVar8 = router_key_pdus;
      if (router_key_pdu_count < uVar12) {
LAB_0010a2f9:
        router_key_pdus = ppVar8;
        memcpy(router_key_pdus + router_key_pdu_count,apStack_100a8,0x7b);
        router_key_pdu_count = router_key_pdu_count + 1;
        bVar2 = false;
      }
      else {
        uVar12 = uVar12 + 100;
        ppVar8 = (pdu_router_key *)lrtr_realloc(router_key_pdus,(ulong)(uVar12 * 0x7b));
        if (ppVar8 != (pdu_router_key *)0x0) goto LAB_0010a2f9;
        builtin_strncpy(txt,"Realloc failed",0xf);
        lrtr_dbg("RTR Socket: %s",txt);
        rtr_change_socket_state(rtr_socket,RTR_ERROR_FATAL);
        bVar2 = true;
      }
      if (bVar2) {
        rtr_change_socket_state(rtr_socket,RTR_ERROR_FATAL);
        timeout = (pdu_router_key **)0xffffffff;
      }
      else {
        timeout = (pdu_router_key **)0x0;
      }
      break;
    case '\n':
      rtr_handle_error_pdu(rtr_socket,apStack_100a8);
      goto LAB_0010a26a;
    case '\v':
      if (aspa_pdus_count < uVar13) {
LAB_0010a1b1:
        size = (ulong)(ushort)apStack_100a8[0].sn._2_2_ * 4 + 0x10;
        __dest = (pdu_aspa *)lrtr_malloc(size);
        if (__dest == (pdu_aspa *)0x0) {
          builtin_strncpy(txt,"Malloc failed",0xe);
          lrtr_dbg("RTR Socket: %s",txt);
          rtr_change_socket_state(rtr_socket,RTR_ERROR_FATAL);
          goto LAB_0010a253;
        }
        memcpy(__dest,apStack_100a8,size);
        aspa_pdus[aspa_pdus_count] = __dest;
        aspa_pdus_count = aspa_pdus_count + 1;
        bVar2 = false;
      }
      else {
        pppVar6 = (pdu_aspa **)lrtr_realloc(aspa_pdus,uVar13 * 8 + 800);
        pppVar3 = pppVar6;
        if (pppVar6 == (pdu_aspa **)0x0) {
          builtin_strncpy(txt,"Realloc failed",0xf);
          lrtr_dbg("RTR Socket: %s",txt);
          rtr_change_socket_state(rtr_socket,RTR_ERROR_FATAL);
          pppVar3 = aspa_pdus;
        }
        aspa_pdus = pppVar3;
        uVar13 = uVar13 + 100;
        if (pppVar6 != (pdu_aspa **)0x0) goto LAB_0010a1b1;
LAB_0010a253:
        bVar2 = true;
      }
      if (bVar2) goto LAB_0010a25d;
      goto LAB_00109ea9;
    }
    if ((uVar5 == 7) || ((int)timeout == -1)) goto LAB_0010a714;
  }
  rtr_change_socket_state(rtr_socket,RTR_ERROR_TRANSPORT);
LAB_0010a70f:
  timeout = (pdu_router_key **)0xffffffff;
LAB_0010a714:
  recv_loop_cleanup(&cleanup_args);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (int)timeout;
  }
LAB_0010a760:
  __stack_chk_fail();
}

Assistant:

static int rtr_sync_receive_and_store_pdus(struct rtr_socket *rtr_socket)
{
	char pdu_data[RTR_MAX_PDU_LEN];
	enum pdu_type type;
	int retval = RTR_SUCCESS;

	struct pdu_ipv6 *ipv6_pdus = NULL;
	unsigned int ipv6_pdus_nindex = 0; // next free index in ipv6_pdus
	unsigned int ipv6_pdus_size = 0;

	struct pdu_ipv4 *ipv4_pdus = NULL;
	unsigned int ipv4_pdus_size = 0;
	unsigned int ipv4_pdus_nindex = 0; // next free index in ipv4_pdus

	struct pdu_router_key *router_key_pdus = NULL;
	unsigned int router_key_pdus_size = 0;
	unsigned int router_key_pdus_nindex = 0;

	struct pdu_aspa **aspa_pdus = NULL;
	size_t aspa_pdus_capacity = 0;
	size_t aspa_pdus_count = 0;

	int oldcancelstate;
	struct recv_loop_cleanup_args cleanup_args = {.ipv4_pdus = &ipv4_pdus,
						      .ipv6_pdus = &ipv6_pdus,
						      .router_key_pdus = &router_key_pdus,
						      .aspa_pdus = &aspa_pdus,
						      .aspa_pdu_count = &aspa_pdus_count};

	// receive LRTR_IPV4/IPV6/ASPA PDUs till EOD
	do {
		pthread_cleanup_push(recv_loop_cleanup, &cleanup_args);
		pthread_setcancelstate(PTHREAD_CANCEL_ENABLE, &oldcancelstate);

		// Receive PDUs, cancellable
		retval = rtr_receive_pdu(rtr_socket, pdu_data, RTR_MAX_PDU_LEN, RTR_RECV_TIMEOUT);

		pthread_setcancelstate(PTHREAD_CANCEL_DISABLE, &oldcancelstate);
		pthread_cleanup_pop(0);

		if (retval == TR_WOULDBLOCK) {
			rtr_change_socket_state(rtr_socket, RTR_ERROR_TRANSPORT);
			retval = RTR_ERROR;
			break;
		} else if (retval < 0) {
			retval = RTR_ERROR;
			break;
		}

		type = rtr_get_pdu_type(pdu_data);

		switch (type) {
		case SERIAL_NOTIFY:
			RTR_DBG1("Ignoring Serial Notify");
			break;

		case IPV4_PREFIX:
			// Temporarily store prefix PDU, handle later after EOD PDU has been received
			if (rtr_store_prefix_pdu(rtr_socket, pdu_data, sizeof(*ipv4_pdus), (void **)&ipv4_pdus,
						 &ipv4_pdus_nindex, &ipv4_pdus_size) == RTR_ERROR) {
				rtr_change_socket_state(rtr_socket, RTR_ERROR_FATAL);
				retval = RTR_ERROR;
			}
			break;

		case IPV6_PREFIX:
			// Temporarily store prefix PDU, handle later after EOD PDU has been received
			if (rtr_store_prefix_pdu(rtr_socket, pdu_data, sizeof(*ipv6_pdus), (void **)&ipv6_pdus,
						 &ipv6_pdus_nindex, &ipv6_pdus_size) == RTR_ERROR) {
				rtr_change_socket_state(rtr_socket, RTR_ERROR_FATAL);
				retval = RTR_ERROR;
			}
			break;

		case ROUTER_KEY:
			// Temporarily store router key PDU, handle later after EOD PDU has been received
			if (rtr_store_router_key_pdu(rtr_socket, pdu_data, sizeof(*router_key_pdus), &router_key_pdus,
						     &router_key_pdus_nindex, &router_key_pdus_size) == RTR_ERROR) {
				rtr_change_socket_state(rtr_socket, RTR_ERROR_FATAL);
				retval = RTR_ERROR;
			}
			break;

		case ASPA:
			// Temporarily store ASPA PDU, handle later after EOD PDU has been received
			if (rtr_store_aspa_pdu(rtr_socket, (struct pdu_aspa *)pdu_data, &aspa_pdus, &aspa_pdus_count,
					       &aspa_pdus_capacity) == RTR_ERROR) {
				rtr_change_socket_state(rtr_socket, RTR_ERROR_FATAL);
				retval = RTR_ERROR;
			}
			break;

		case ERROR:
			rtr_handle_error_pdu(rtr_socket, pdu_data);
			retval = RTR_ERROR;
			break;

		case EOD:
			RTR_DBG1("EOD PDU received.");
			struct pdu_end_of_data_v0 *eod_pdu = (struct pdu_end_of_data_v0 *)pdu_data;

			retval = rtr_handle_eod_pdu(rtr_socket, eod_pdu, pdu_data);
			if (retval != RTR_SUCCESS)
				break;

			if (rtr_socket->is_resetting) {
				// Use table copies instead in order to perform an atomic update
				RTR_DBG1("Reset in progress creating shadow table for atomic reset");

				struct pfx_table *pfx_shadow_table = lrtr_malloc(sizeof(struct pfx_table));

				if (!pfx_shadow_table) {
					RTR_DBG1("Memory allocation for pfx shadow table failed");
					retval = RTR_ERROR;
					goto cleanup;
				}
				pfx_table_init(pfx_shadow_table, NULL);
				if (pfx_table_copy_except_socket(rtr_socket->pfx_table, pfx_shadow_table, rtr_socket) !=
				    PFX_SUCCESS) {
					RTR_DBG1("Creation of pfx shadow table failed");
					rtr_change_socket_state(rtr_socket, RTR_ERROR_FATAL);
					retval = RTR_ERROR;
					goto cleanup;
				}

				struct spki_table *spki_shadow_table = lrtr_malloc(sizeof(struct spki_table));

				if (!spki_shadow_table) {
					RTR_DBG1("Memory allocation for spki shadow table failed");
					retval = RTR_ERROR;
					goto cleanup;
				}
				spki_table_init(spki_shadow_table, NULL);
				if (spki_table_copy_except_socket(rtr_socket->spki_table, spki_shadow_table,
								  rtr_socket) != SPKI_SUCCESS) {
					RTR_DBG1("Creation of spki shadow table failed");
					rtr_change_socket_state(rtr_socket, RTR_ERROR_FATAL);
					retval = RTR_ERROR;
					goto cleanup;
				}

				struct aspa_table *aspa_shadow_table = lrtr_malloc(sizeof(struct aspa_table));

				if (!aspa_shadow_table) {
					RTR_DBG1("Memory allocation for aspa shadow table failed");
					retval = RTR_ERROR;
					goto cleanup;
				}
				aspa_table_init(aspa_shadow_table, NULL);

				RTR_DBG1("Shadow tables created");

				retval = rtr_sync_update_tables(rtr_socket, pfx_shadow_table, spki_shadow_table,
								aspa_shadow_table, ipv4_pdus, ipv4_pdus_nindex,
								ipv6_pdus, ipv6_pdus_nindex, router_key_pdus,
								router_key_pdus_nindex, aspa_pdus, aspa_pdus_count,
								eod_pdu);

				if (retval == RTR_SUCCESS) {
					RTR_DBG1("Reset finished. Swapping new table in.");
					pfx_table_swap(rtr_socket->pfx_table, pfx_shadow_table);
					spki_table_swap(rtr_socket->spki_table, spki_shadow_table);

					// No need to notify shadow table's clients as it hasn't any.
					RTR_DBG1("Replacing ASPA records");
					aspa_table_src_replace(rtr_socket->aspa_table, aspa_shadow_table, rtr_socket,
							       !!rtr_socket->aspa_table->update_fp, false);

					if (rtr_socket->pfx_table->update_fp) {
						RTR_DBG1("Calculating and notifying pfx diff");
						pfx_table_notify_diff(rtr_socket->pfx_table, pfx_shadow_table,
								      rtr_socket);
					} else {
						RTR_DBG1("No pfx update callback. Skipping diff");
					}

					if (rtr_socket->spki_table->update_fp) {
						RTR_DBG1("Calculating and notifying spki diff");
						spki_table_notify_diff(rtr_socket->spki_table, spki_shadow_table,
								       rtr_socket);
					} else {
						RTR_DBG1("No spki update callback. Skipping diff");
					}
				}

			cleanup:
				RTR_DBG1("Freeing shadow tables.");
				if (pfx_shadow_table) {
					pfx_table_free_without_notify(pfx_shadow_table);
					lrtr_free(pfx_shadow_table);
				}

				if (spki_shadow_table) {
					spki_table_free_without_notify(spki_shadow_table);
					lrtr_free(spki_shadow_table);
				}

				if (aspa_shadow_table) {
					aspa_table_free(aspa_shadow_table, false);
					lrtr_free(aspa_shadow_table);
				}

				rtr_socket->is_resetting = false;
			} else {
				retval = rtr_sync_update_tables(rtr_socket, rtr_socket->pfx_table,
								rtr_socket->spki_table, rtr_socket->aspa_table,
								ipv4_pdus, ipv4_pdus_nindex, ipv6_pdus,
								ipv6_pdus_nindex, router_key_pdus,
								router_key_pdus_nindex, aspa_pdus, aspa_pdus_count,
								eod_pdu);
			}

			break;

		default:
			RTR_DBG("Received unexpected PDU (Type: %u)", ((struct pdu_header *)pdu_data)->type);
			const char txt[] = "Unexpected PDU received during data synchronisation";

			rtr_send_error_pdu_from_host(rtr_socket, pdu_data, sizeof(struct pdu_header), CORRUPT_DATA, txt,
						     sizeof(txt));
			retval = RTR_ERROR;
			break;
		}
	} while (type != EOD && retval != RTR_ERROR);

	recv_loop_cleanup(&cleanup_args);
	return retval;
}